

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  Db *pDVar4;
  byte *pbVar5;
  uint uVar6;
  char *pcVar7;
  Table *pTVar8;
  uchar *b;
  byte *pbVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  if (zName == (char *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0xffffffff;
    pcVar7 = zName;
    do {
      uVar10 = uVar10 + 1;
      cVar1 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar1 != '\0');
    uVar10 = uVar10 & 0x3fffffff;
  }
  uVar3 = db->nDb;
  if (0 < (int)uVar3) {
    pDVar4 = db->aDb;
    uVar12 = 0;
    do {
      uVar6 = uVar12 < 2 ^ uVar12;
      if (zDatabase == (char *)0x0) {
LAB_00145c1a:
        pTVar8 = (Table *)sqlite3HashFind(&(pDVar4[uVar6].pSchema)->tblHash,zName,uVar10);
        if (pTVar8 != (Table *)0x0) {
          return pTVar8;
        }
      }
      else {
        pbVar9 = (byte *)pDVar4[uVar6].zName;
        bVar2 = *zDatabase;
        pbVar5 = (byte *)(zDatabase + 1);
        while (bVar2 != 0) {
          uVar11 = (ulong)bVar2;
          if (""[uVar11] != ""[*pbVar9]) goto LAB_00145c0d;
          pbVar9 = pbVar9 + 1;
          bVar2 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        }
        uVar11 = 0;
LAB_00145c0d:
        if (""[uVar11] == ""[*pbVar9]) goto LAB_00145c1a;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar3);
  }
  return (Table *)0x0;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;
  int nName;
  assert( zName!=0 );
  nName = sqlite3Strlen30(zName);
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
    if( zDatabase!=0 && sqlite3StrICmp(zDatabase, db->aDb[j].zName) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName, nName);
    if( p ) break;
  }
  return p;
}